

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

void BZ2_hbMakeCodeLengths(UChar *len,Int32 *freq,Int32 alphaSize,Int32 maxLen)

{
  int iVar1;
  int in_ECX;
  int iVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  Int32 tmp_3;
  Int32 zz_3;
  Int32 tmp_2;
  Int32 yy_1;
  Int32 zz_2;
  Int32 tmp_1;
  Int32 yy;
  Int32 zz_1;
  Int32 tmp;
  Int32 zz;
  Int32 parent [516];
  Int32 weight [516];
  Int32 heap [260];
  Bool tooLong;
  Int32 k;
  Int32 j;
  Int32 i;
  Int32 n2;
  Int32 n1;
  Int32 nHeap;
  Int32 nNodes;
  uint local_149c;
  int local_1494;
  int local_148c;
  int local_1484;
  int local_1480;
  int local_1478;
  int local_1474;
  int local_146c;
  int local_1468 [516];
  uint local_c58 [516];
  int local_448 [260];
  char local_35;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  long local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
    if (*(int *)(local_10 + (long)local_2c * 4) == 0) {
      local_1494 = 1;
    }
    else {
      local_1494 = *(int *)(local_10 + (long)local_2c * 4);
    }
    local_c58[local_2c + 1] = local_1494 << 8;
  }
  do {
    local_1c = local_14;
    local_20 = 0;
    local_448[0] = 0;
    local_c58[0] = 0;
    local_1468[0] = -2;
    for (local_2c = 1; local_2c <= local_14; local_2c = local_2c + 1) {
      local_1468[local_2c] = -1;
      local_20 = local_20 + 1;
      local_448[local_20] = local_2c;
      local_146c = local_20;
      iVar1 = local_448[local_20];
      while (iVar2 = local_146c >> 1, (int)local_c58[iVar1] < (int)local_c58[local_448[iVar2]]) {
        local_448[local_146c] = local_448[iVar2];
        local_146c = iVar2;
      }
      local_448[local_146c] = iVar1;
    }
    if (0x103 < local_20) {
      bz_internal_error(0x7d1);
    }
    while (1 < local_20) {
      local_24 = local_448[1];
      iVar1 = local_448[local_20];
      local_448[1] = iVar1;
      local_20 = local_20 + -1;
      local_1474 = 1;
      while (local_1478 = local_1474 * 2, local_1478 <= local_20) {
        if ((local_1478 < local_20) &&
           ((int)local_c58[local_448[local_1478 + 1]] < (int)local_c58[local_448[local_1478]])) {
          local_1478 = local_1478 + 1;
        }
        if ((int)local_c58[iVar1] < (int)local_c58[local_448[local_1478]]) break;
        local_448[local_1474] = local_448[local_1478];
        local_1474 = local_1478;
      }
      local_448[local_1474] = iVar1;
      local_28 = local_448[1];
      iVar1 = local_448[local_20];
      local_448[1] = iVar1;
      local_20 = local_20 + -1;
      local_1480 = 1;
      while (local_1484 = local_1480 * 2, local_1484 <= local_20) {
        if ((local_1484 < local_20) &&
           ((int)local_c58[local_448[local_1484 + 1]] < (int)local_c58[local_448[local_1484]])) {
          local_1484 = local_1484 + 1;
        }
        if ((int)local_c58[iVar1] < (int)local_c58[local_448[local_1484]]) break;
        local_448[local_1480] = local_448[local_1484];
        local_1480 = local_1484;
      }
      local_448[local_1480] = iVar1;
      local_1c = local_1c + 1;
      local_1468[local_28] = local_1c;
      local_1468[local_24] = local_1c;
      if ((local_c58[local_28] & 0xff) < (local_c58[local_24] & 0xff)) {
        local_149c = local_c58[local_24];
      }
      else {
        local_149c = local_c58[local_28];
      }
      local_149c = local_149c & 0xff;
      local_c58[local_1c] =
           (local_c58[local_24] & 0xffffff00) + (local_c58[local_28] & 0xffffff00) | local_149c + 1;
      local_1468[local_1c] = -1;
      local_20 = local_20 + 1;
      local_448[local_20] = local_1c;
      local_148c = local_20;
      iVar1 = local_448[local_20];
      while (iVar2 = local_148c >> 1, (int)local_c58[iVar1] < (int)local_c58[local_448[iVar2]]) {
        local_448[local_148c] = local_448[iVar2];
        local_148c = iVar2;
      }
      local_448[local_148c] = iVar1;
    }
    if (0x203 < local_1c) {
      bz_internal_error(0x7d2);
    }
    local_35 = '\0';
    for (local_2c = 1; local_2c <= local_14; local_2c = local_2c + 1) {
      local_30 = 0;
      for (local_34 = local_2c; -1 < local_1468[local_34]; local_34 = local_1468[local_34]) {
        local_30 = local_30 + 1;
      }
      *(char *)(local_8 + (local_2c + -1)) = (char)local_30;
      if (local_18 < local_30) {
        local_35 = '\x01';
      }
    }
    if (local_35 == '\0') {
      return;
    }
    for (local_2c = 1; local_2c <= local_14; local_2c = local_2c + 1) {
      local_30 = ((int)local_c58[local_2c] >> 8) / 2 + 1;
      local_c58[local_2c] = local_30 * 0x100;
    }
  } while( true );
}

Assistant:

void BZ2_hbMakeCodeLengths ( UChar *len, 
                             Int32 *freq,
                             Int32 alphaSize,
                             Int32 maxLen )
{
   /*--
      Nodes and heap entries run from 1.  Entry 0
      for both the heap and nodes is a sentinel.
   --*/
   Int32 nNodes, nHeap, n1, n2, i, j, k;
   Bool  tooLong;

   Int32 heap   [ BZ_MAX_ALPHA_SIZE + 2 ];
   Int32 weight [ BZ_MAX_ALPHA_SIZE * 2 ];
   Int32 parent [ BZ_MAX_ALPHA_SIZE * 2 ]; 

   for (i = 0; i < alphaSize; i++)
      weight[i+1] = (freq[i] == 0 ? 1 : freq[i]) << 8;

   while (True) {

      nNodes = alphaSize;
      nHeap = 0;

      heap[0] = 0;
      weight[0] = 0;
      parent[0] = -2;

      for (i = 1; i <= alphaSize; i++) {
         parent[i] = -1;
         nHeap++;
         heap[nHeap] = i;
         UPHEAP(nHeap);
      }

      AssertH( nHeap < (BZ_MAX_ALPHA_SIZE+2), 2001 );
   
      while (nHeap > 1) {
         n1 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         n2 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         nNodes++;
         parent[n1] = parent[n2] = nNodes;
         weight[nNodes] = ADDWEIGHTS(weight[n1], weight[n2]);
         parent[nNodes] = -1;
         nHeap++;
         heap[nHeap] = nNodes;
         UPHEAP(nHeap);
      }

      AssertH( nNodes < (BZ_MAX_ALPHA_SIZE * 2), 2002 );

      tooLong = False;
      for (i = 1; i <= alphaSize; i++) {
         j = 0;
         k = i;
         while (parent[k] >= 0) { k = parent[k]; j++; }
         len[i-1] = j;
         if (j > maxLen) tooLong = True;
      }
      
      if (! tooLong) break;

      /* 17 Oct 04: keep-going condition for the following loop used
         to be 'i < alphaSize', which missed the last element,
         theoretically leading to the possibility of the compressor
         looping.  However, this count-scaling step is only needed if
         one of the generated Huffman code words is longer than
         maxLen, which up to and including version 1.0.2 was 20 bits,
         which is extremely unlikely.  In version 1.0.3 maxLen was
         changed to 17 bits, which has minimal effect on compression
         ratio, but does mean this scaling step is used from time to
         time, enough to verify that it works.

         This means that bzip2-1.0.3 and later will only produce
         Huffman codes with a maximum length of 17 bits.  However, in
         order to preserve backwards compatibility with bitstreams
         produced by versions pre-1.0.3, the decompressor must still
         handle lengths of up to 20. */

      for (i = 1; i <= alphaSize; i++) {
         j = weight[i] >> 8;
         j = 1 + (j / 2);
         weight[i] = j << 8;
      }
   }
}